

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceiverPdu.cpp
# Opt level: O0

int __thiscall DIS::ReceiverPdu::getMarshalledSize(ReceiverPdu *this)

{
  int iVar1;
  int iVar2;
  int marshalSize;
  ReceiverPdu *this_local;
  
  iVar1 = RadioCommunicationsFamilyPdu::getMarshalledSize(&this->super_RadioCommunicationsFamilyPdu)
  ;
  iVar2 = EntityID::getMarshalledSize(&this->_transmitterEntityId);
  return iVar1 + iVar2 + 10;
}

Assistant:

int ReceiverPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = RadioCommunicationsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 2;  // _receiverState
   marshalSize = marshalSize + 2;  // _padding1
   marshalSize = marshalSize + 4;  // _receivedPoser
   marshalSize = marshalSize + _transmitterEntityId.getMarshalledSize();  // _transmitterEntityId
   marshalSize = marshalSize + 2;  // _transmitterRadioId
    return marshalSize;
}